

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

void __thiscall
dg::llvmdg::DOD::DOD(DOD *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  size_type __n;
  LLVMControlDependenceAnalysisOptions LStack_78;
  
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(&LStack_78,opts);
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (&this->super_LLVMControlDependenceAnalysisImpl,module,&LStack_78);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(&LStack_78);
  (this->super_LLVMControlDependenceAnalysisImpl)._vptr_LLVMControlDependenceAnalysisImpl =
       (_func_int **)&PTR__DOD_00173c28;
  (this->graphBuilder)._nodes._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->graphBuilder)._nodes._M_h._M_bucket_count = 0;
  (this->graphBuilder)._nodes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphBuilder)._nodes._M_h._M_element_count = 0;
  *(undefined8 *)&(this->graphBuilder)._nodes._M_h._M_rehash_policy = 0;
  (this->graphBuilder)._nodes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphBuilder)._nodes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_bucket_count = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_element_count = 0;
  *(undefined8 *)&(this->graphBuilder)._rev_mapping._M_h._M_rehash_policy = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  CDGraphBuilder::CDGraphBuilder(&this->graphBuilder);
  (this->_graphs)._M_h._M_buckets = &(this->_graphs)._M_h._M_single_bucket;
  (this->_graphs)._M_h._M_bucket_count = 1;
  (this->_graphs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_graphs)._M_h._M_element_count = 0;
  (this->_graphs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_graphs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_graphs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __n = llvm::simple_ilist<llvm::Function>::size((simple_ilist<llvm::Function> *)(module + 0x18));
  std::__detail::
  _Rehash_base<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->_graphs,__n);
  return;
}

Assistant:

DOD(const llvm::Module *module,
        const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {
        _graphs.reserve(module->size());
    }